

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O1

void Abc_NodeShowCut(Abc_Obj_t *pNode,int nNodeSizeMax,int nConeSizeMax)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  Abc_ManCut_t *p;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *vVisited;
  void **ppvVar6;
  char *pName;
  FILE *pFVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  char FileNameDot [200];
  Abc_Obj_t *local_108;
  Abc_ManCut_t *local_100;
  char local_f8 [200];
  
  local_108 = pNode;
  if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcShow.c"
                  ,0xd7,"void Abc_NodeShowCut(Abc_Obj_t *, int, int)");
  }
  p = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000000000);
  vLeaves = Abc_NodeFindCut(p,local_108,1);
  pVVar5 = Abc_NtkManCutReadCutLarge(p);
  vVisited = Abc_NtkManCutReadVisited(p);
  Abc_NodeConeCollect(&local_108,1,pVVar5,vVisited,1);
  local_100 = p;
  pVVar5 = Abc_NodeCollectTfoCands(p,local_108,vLeaves,1000000000);
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar10];
      uVar1 = vVisited->nSize;
      if (0 < (long)(int)uVar1) {
        lVar8 = 0;
        do {
          if (vVisited->pArray[lVar8] == pvVar3) goto LAB_008791b3;
          lVar8 = lVar8 + 1;
        } while ((int)uVar1 != lVar8);
      }
      uVar2 = vVisited->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vVisited->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
          }
          vVisited->pArray = ppvVar6;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar2 * 2;
          if (iVar9 <= (int)uVar2) goto LAB_008791a0;
          if (vVisited->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
          }
          vVisited->pArray = ppvVar6;
        }
        vVisited->nCap = iVar9;
      }
LAB_008791a0:
      iVar9 = vVisited->nSize;
      vVisited->nSize = iVar9 + 1;
      vVisited->pArray[iVar9] = pvVar3;
LAB_008791b3:
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  pName = Abc_ObjName(local_108);
  Abc_ShowGetFileName(pName,local_f8);
  pFVar7 = fopen(local_f8,"w");
  pAVar4 = local_108;
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
    return;
  }
  uVar1 = vLeaves->nCap;
  if (vLeaves->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vLeaves->pArray,0x80);
      }
      vLeaves->pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_00879282;
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
      }
      vLeaves->pArray = ppvVar6;
    }
    vLeaves->nCap = iVar9;
  }
LAB_00879282:
  iVar9 = vLeaves->nSize;
  vLeaves->nSize = iVar9 + 1;
  vLeaves->pArray[iVar9] = pAVar4;
  Io_WriteDotNtk(local_108->pNtk,vVisited,vLeaves,local_f8,0,0);
  Abc_NtkManCutStop(local_100);
  Abc_ShowFile(local_f8);
  return;
}

Assistant:

void Abc_NodeShowCut( Abc_Obj_t * pNode, int nNodeSizeMax, int nConeSizeMax )
{
    FILE * pFile;
    char FileNameDot[200];
    Abc_ManCut_t * p;
    Vec_Ptr_t * vCutSmall;
    Vec_Ptr_t * vCutLarge;
    Vec_Ptr_t * vInside;
    Vec_Ptr_t * vNodesTfo;
    Abc_Obj_t * pTemp;
    int i;

    assert( Abc_NtkIsStrash(pNode->pNtk) );

    // start the cut computation manager
    p = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, ABC_INFINITY );
    // get the recovergence driven cut
    vCutSmall = Abc_NodeFindCut( p, pNode, 1 );
    // get the containing cut
    vCutLarge = Abc_NtkManCutReadCutLarge( p );
    // get the array for the inside nodes
    vInside = Abc_NtkManCutReadVisited( p );
    // get the inside nodes of the containing cone
    Abc_NodeConeCollect( &pNode, 1, vCutLarge, vInside, 1 );

    // add the nodes in the TFO 
    vNodesTfo = Abc_NodeCollectTfoCands( p, pNode, vCutSmall, ABC_INFINITY );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodesTfo, pTemp, i )
        Vec_PtrPushUnique( vInside, pTemp );

    // create the file name
    Abc_ShowGetFileName( Abc_ObjName(pNode), FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    // add the root node to the cone (for visualization)
    Vec_PtrPush( vCutSmall, pNode );
    // write the DOT file
    Io_WriteDotNtk( pNode->pNtk, vInside, vCutSmall, FileNameDot, 0, 0 );
    // stop the cut computation manager
    Abc_NtkManCutStop( p );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}